

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  ImGuiWindowTempData *min;
  float fVar3;
  float fVar4;
  float _x;
  float fVar5;
  ImVec2 IVar6;
  ImRect bb;
  float line_height;
  float text_base_offset_y;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff28;
  ImVec2 *this;
  __va_list_tag *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  char *in_stack_ffffffffffffff48;
  ImRect *nav_bb_arg;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ImRect *bb_00;
  undefined1 hide_text_after_hash;
  undefined4 in_stack_ffffffffffffff70;
  ImVec2 in_stack_ffffffffffffff78;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  ImRect local_58;
  float local_48;
  float local_44;
  ImVec2 local_40;
  char *local_38;
  char *local_30;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  ImGuiWindow *local_18;
  
  local_18 = GetCurrentWindow();
  if ((local_18->SkipItems & 1U) == 0) {
    local_20 = GImGui;
    local_28 = &GImGui->Style;
    bb_00 = (ImRect *)GImGui->TempBuffer;
    local_30 = (char *)bb_00;
    iVar2 = ImFormatStringV(in_stack_ffffffffffffff48,
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_38 = (char *)((long)&(bb_00->Min).x + (long)iVar2);
    local_40 = CalcTextSize((char *)bb_00,
                            (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0),
                            SUB84(in_stack_ffffffffffffff48,0));
    local_44 = ImMax<float>(0.0,(local_18->DC).CurrentLineTextBaseOffset);
    fVar3 = (local_20->Style).FramePadding.y;
    fVar3 = ImMin<float>((local_18->DC).CurrentLineSize.y,fVar3 + fVar3 + local_20->FontSize);
    local_48 = ImMax<float>(fVar3,local_20->FontSize);
    min = &local_18->DC;
    hide_text_after_hash = (undefined1)((ulong)&local_18->DC >> 0x38);
    fVar3 = local_20->FontSize;
    if (local_40.x <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (local_28->FramePadding).x;
      fVar4 = fVar4 + fVar4 + local_40.x;
    }
    _x = fVar3 + fVar4;
    fVar5 = ImMax<float>(local_48,local_40.y);
    nav_bb_arg = &local_68;
    ImVec2::ImVec2(&nav_bb_arg->Min,_x,fVar5);
    local_68.Max = operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x1757d9);
    fVar5 = (float)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    ImRect::ImRect(&local_58,&min->CursorPos,&local_68.Max);
    ItemSize((ImRect *)in_stack_ffffffffffffff30,fVar5);
    bVar1 = ItemAdd(bb_00,(ImGuiID)fVar4,nav_bb_arg);
    if (bVar1) {
      this = &local_78;
      ImVec2::ImVec2(this,local_20->FontSize * 0.5 + (local_28->FramePadding).x,local_48 * 0.5);
      local_70 = operator+(this,(ImVec2 *)0x175880);
      IVar6.y = _x;
      IVar6.x = in_stack_ffffffffffffff40;
      RenderBullet(IVar6);
      fVar4 = (local_28->FramePadding).x;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,fVar4 + fVar4 + local_20->FontSize,local_44)
      ;
      IVar6 = operator+(this,(ImVec2 *)0x1758dd);
      RenderText(IVar6,(char *)in_stack_ffffffffffffff78,
                 (char *)CONCAT44(fVar3,in_stack_ffffffffffffff70),(bool)hide_text_after_hash);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin = g.TempBuffer;
    const char* text_end = text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const float text_base_offset_y = ImMax(0.0f, window->DC.CurrentLineTextBaseOffset); // Latch before ItemSize changes it
    const float line_height = ImMax(ImMin(window->DC.CurrentLineSize.y, g.FontSize + g.Style.FramePadding.y*2), g.FontSize);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x*2) : 0.0f), ImMax(line_height, label_size.y)));  // Empty text doesn't add padding
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    RenderBullet(bb.Min + ImVec2(style.FramePadding.x + g.FontSize*0.5f, line_height*0.5f));
    RenderText(bb.Min+ImVec2(g.FontSize + style.FramePadding.x*2, text_base_offset_y), text_begin, text_end, false);
}